

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm_instr.c
# Opt level: O0

arm_instr_type_t get_arm_instr_type_hash(uint32_t hash)

{
  uint8_t opcode_1;
  uint8_t flags;
  uint8_t opcode;
  uint32_t hash_local;
  undefined4 local_4;
  
  if ((hash & 0xf00) == 0xf00) {
    local_4 = SOFTWARE_INTERRUPT;
  }
  else if ((hash & 0xe00) == 0xc00) {
    local_4 = COPROCESSOR_DATA_TRANSFER;
  }
  else if ((hash & 0xf01) == 0xe00) {
    local_4 = COPROCESSOR_DATA_OPERATION;
  }
  else if ((hash & 0xf01) == 0xe01) {
    local_4 = COPROCESSOR_REGISTER_TRANSFER;
  }
  else if ((hash & 0xe00) == 0xa00) {
    local_4 = BRANCH;
  }
  else if ((hash & 0xe00) == 0x800) {
    local_4 = BLOCK_DATA_TRANSFER;
  }
  else if ((hash & 0xe01) == 0x601) {
    local_4 = UNDEFINED;
  }
  else if ((hash & 0xc00) == 0x400) {
    local_4 = SINGLE_DATA_TRANSFER;
  }
  else if ((hash & 0xfff) == 0x121) {
    local_4 = BRANCH_EXCHANGE;
  }
  else if ((hash & 0xfcf) == 9) {
    local_4 = MULTIPLY;
  }
  else if ((hash & 0xf8f) == 0x89) {
    local_4 = MULTIPLY_LONG;
  }
  else if ((hash & 0xfbf) == 0x109) {
    local_4 = SINGLE_DATA_SWAP;
  }
  else if ((hash & 0xe09) == 9) {
    if ((hash >> 1 & 3) == 0) {
      local_4 = UNDEFINED;
    }
    else if ((hash & 0x40) == 0) {
      local_4 = HALFWORD_DT_RO;
    }
    else {
      local_4 = HALFWORD_DT_IO;
    }
  }
  else if ((hash & 0xd90) == 0x100) {
    local_4 = STATUS_TRANSFER;
  }
  else if ((hash & 0xc00) == 0) {
    if (((int)(uint)((byte)(hash >> 5) & 0xf) >> 2 == 2) && ((hash >> 4 & 1) == 0)) {
      local_4 = UNDEFINED;
    }
    else {
      local_4 = DATA_PROCESSING;
    }
  }
  else {
    local_4 = UNDEFINED;
  }
  return local_4;
}

Assistant:

arm_instr_type_t get_arm_instr_type_hash(word hash) {
    if ((hash & 0b111100000000u) == 0b111100000000u) {
        return SOFTWARE_INTERRUPT;
    }
    if ((hash & 0b111000000000u) == 0b110000000000u) {
        return COPROCESSOR_DATA_TRANSFER;
    }
    if ((hash & 0b111100000001u) == 0b111000000000u) {
        return COPROCESSOR_DATA_OPERATION;
    }
    if ((hash & 0b111100000001u) == 0b111000000001u) {
        return COPROCESSOR_REGISTER_TRANSFER;
    }
    if ((hash & 0b111000000000u) == 0b101000000000u) {
        return BRANCH;
    }
    if ((hash & 0b111000000000u) == 0b100000000000u) {
        return BLOCK_DATA_TRANSFER;
    }
    if ((hash & 0b111000000001u) == 0b011000000001u) {
        return UNDEFINED;
    }
    if ((hash & 0b110000000000u) == 0b010000000000u) {
        return SINGLE_DATA_TRANSFER;
    }
    if ((hash & 0b111111111111u) == 0b000100100001u) {
        return BRANCH_EXCHANGE;
    }
    if ((hash & 0b111111001111u) == 0b000000001001u) {
        return MULTIPLY;
    }
    if ((hash & 0b111110001111u) == 0b000010001001u) {
        return MULTIPLY_LONG;
    }
    if ((hash & 0b111110111111u) == 0b000100001001u) {
        return SINGLE_DATA_SWAP;
    }

    if ((hash & 0b111000001001u) == 0b000000001001u) {
        byte opcode = (hash >> 1u) & 0b11u;

        if (opcode == 0b00){
            return UNDEFINED;
        }
        else if (hash & 0x40u) {
            return HALFWORD_DT_IO;
        }
        else {
            return HALFWORD_DT_RO;
        }
    }
    if ((hash & 0b110110010000u) == 0b000100000000u) {
        return STATUS_TRANSFER;
    }

    if ((hash & 0b110000000000u) == 0b000000000000u) {
        byte flags = (hash >> 4u) & 1u;
        byte opcode = (hash >> 5u) & 0b1111u;

        if ((opcode >> 2u) == 0b10 && !flags) {
            return UNDEFINED;
        }
        else {
            return DATA_PROCESSING;
        }
    }
    return UNDEFINED;
}